

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O2

void __thiscall
cpprofiler::Connector::start(Connector *this,string *file_path,int execution_id,bool has_restarts)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  string base_name;
  string info;
  string local_1c8 [32];
  stringstream ss;
  ostream local_198 [376];
  
  std::__cxx11::string::string((string *)&base_name,(string *)file_path);
  lVar1 = std::__cxx11::string::rfind((char)&base_name,0x2f);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&ss,(ulong)&base_name);
    std::__cxx11::string::operator=((string *)&base_name,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
  }
  std::__cxx11::string::string((string *)&info,"",(allocator *)&ss);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator<<(local_198,"{");
  poVar2 = std::operator<<(local_198,"\"has_restarts\": ");
  pcVar3 = "false";
  if (has_restarts) {
    pcVar3 = "true";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(local_198,",\"name\": ");
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(poVar2,(string *)&base_name);
  poVar2 = std::operator<<(poVar2,"\"");
  std::operator<<(poVar2,"\n");
  if (execution_id != -1) {
    poVar2 = std::operator<<(local_198,",\"execution_id\": ");
    std::ostream::operator<<((ostream *)poVar2,execution_id);
  }
  std::operator<<(local_198,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&info,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  MessageMarshalling::makeStart(&this->marshalling,&info);
  sendOverSocket(this);
  std::__cxx11::string::~string((string *)&info);
  std::__cxx11::string::~string((string *)&base_name);
  return;
}

Assistant:

void start(const std::string& file_path = "",
               int execution_id = -1, bool has_restarts = false) {
    /// extract fzn file name
    std::string base_name(file_path);
    {
      size_t pos = base_name.find_last_of('/');
      if (pos != static_cast<size_t>(-1)) {
        base_name = base_name.substr(pos + 1, base_name.length() - pos - 1);
      }
    }

    std::string info{""};
    {
      std::stringstream ss;
      ss << "{";
      ss << "\"has_restarts\": " << (has_restarts ? "true" : "false")  << "\n";
      ss << ",\"name\": " << "\"" << base_name << "\"" << "\n";
      if (execution_id != -1) {
        ss << ",\"execution_id\": " << execution_id;
      }
      ss << "}";
      info = ss.str();
    }

    marshalling.makeStart(info);
    sendOverSocket();
  }